

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineApplyBuiltInTargetWithArray
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *applyInfo,
          FunctionJITTimeInfo *builtInInfo,bool *pIsInlined)

{
  OpCode OVar1;
  code *pcVar2;
  JnHelperMethod fnHelper;
  BuiltinFunction BVar3;
  bool bVar4;
  uint localFuncId;
  HelperCallOpnd *pHVar5;
  undefined4 *puVar6;
  Opnd *opnd;
  ByteCodeUsesInstr *this_00;
  Instr *pIVar7;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  StackSym *pSVar8;
  SymOpnd *pSVar9;
  Inline *this_01;
  Instr *local_b0;
  Instr *implicitThisArgOut;
  AutoReuseOpnd autoReuseOriginalCallSrc1;
  uint local_84;
  PragmaInstr *pPStack_80;
  uint argOutCount;
  Instr *explicitThisArgOut;
  Instr *arrayArgOut;
  Instr *applyTargetLdInstr;
  PragmaInstr *local_60;
  Instr *local_58;
  Instr *local_50;
  HelperCallOpnd *local_48;
  Instr *local_40;
  bool *local_38;
  
  pIVar7 = callInstr->m_next;
  applyTargetLdInstr = (Instr *)applyInfo;
  localFuncId = FunctionJITTimeInfo::GetLocalFunctionId(builtInInfo);
  BVar3 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
  if (BVar3._value == '$') {
    fnHelper = HelperOp_MaxInAnArray;
  }
  else {
    if (BVar3._value != '%') {
      return pIVar7;
    }
    fnHelper = HelperOp_MinInAnArray;
  }
  local_40 = pIVar7;
  local_38 = pIsInlined;
  pHVar5 = IR::HelperCallOpnd::New(fnHelper,callInstr->m_func);
  local_b0 = (Instr *)0x0;
  pPStack_80 = (PragmaInstr *)0x0;
  explicitThisArgOut = (Instr *)0x0;
  local_84 = 0;
  GetArgInstrsForCallAndApply
            (this,callInstr,&local_b0,(Instr **)&stack0xffffffffffffff80,&explicitThisArgOut,
             &local_84);
  local_50 = local_b0;
  if (local_b0 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa83,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar4) goto LAB_005093a1;
    *puVar6 = 0;
  }
  local_60 = pPStack_80;
  if (pPStack_80 == (PragmaInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa84,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar4) goto LAB_005093a1;
    *puVar6 = 0;
  }
  local_58 = explicitThisArgOut;
  if (explicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa85,"(arrayArgOut)","arrayArgOut");
    if (!bVar4) {
LAB_005093a1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  OVar1 = callInstr->m_opcode;
  local_48 = pHVar5;
  opnd = IR::Opnd::Copy(callInstr->m_src1,this->topFunc);
  this_01 = (Inline *)&implicitThisArgOut;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)this_01,opnd,this->topFunc,true);
  arrayArgOut = (Instr *)0x0;
  bVar4 = TryGetCallApplyAndTargetLdInstrs
                    (this_01,callInstr,(Instr **)&autoReuseOriginalCallSrc1.autoDelete,&arrayArgOut)
  ;
  if (bVar4) {
    *local_38 = true;
    IR::Instr::ReplaceSrc1(callInstr,arrayArgOut->m_dst);
    this_00 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,callInstr,builtInInfo,false,true,false,true);
    if (this_00 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Remove(&this_00->super_Instr);
    }
    callInstr->m_opcode = OVar1;
    IR::Instr::ReplaceSrc1(callInstr,opnd);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns
              (this,callInstr,callInstr,(FunctionJITTimeInfo *)applyTargetLdInstr,false,true,false,
               true);
    pIVar7 = InsertInlineeBuiltInStartEndTags(this,callInstr,3,(Instr **)0x0);
    pIVar7->m_opcode = InlineNonTrackingBuiltInEnd;
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    src1Opnd = IR::IntConstOpnd::New(2,TyInt32,callInstr->m_func,false);
    pIVar7 = IR::Instr::New(StartCall,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar7);
    pSVar8 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar9 = IR::SymOpnd::New(&pSVar8->super_Sym,0,TyVar,callInstr->m_func);
    pIVar7 = IR::Instr::New(ArgOut_A,&pSVar9->super_Opnd,(local_60->super_Instr).m_src1,
                            pIVar7->m_dst,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar7);
    pSVar8 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,2);
    pSVar9 = IR::SymOpnd::New(&pSVar8->super_Sym,0,TyVar,callInstr->m_func);
    pIVar7 = IR::Instr::New(ArgOut_A,&pSVar9->super_Opnd,local_58->m_src1,pIVar7->m_dst,
                            callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar7);
    pSVar8 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
    pSVar9 = IR::SymOpnd::New(&pSVar8->super_Sym,0,TyUint64,callInstr->m_func);
    pIVar7 = IR::Instr::New(ArgOut_A_InlineSpecialized,&pSVar9->super_Opnd,local_50->m_src1,
                            pIVar7->m_dst,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar7);
    callInstr->m_opcode = CallDirect;
    IR::Instr::ReplaceSrc1(callInstr,&local_48->super_Opnd);
    IR::Instr::ReplaceSrc2(callInstr,pIVar7->m_dst);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&implicitThisArgOut);
  return local_40;
}

Assistant:

IR::Instr * Inline::InlineApplyBuiltInTargetWithArray(IR::Instr * callInstr, const FunctionJITTimeInfo * applyInfo, const FunctionJITTimeInfo * builtInInfo, bool * pIsInlined)
{
    IR::Instr * instrNext = callInstr->m_next;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(builtInInfo->GetLocalFunctionId());
    IR::HelperCallOpnd * helperCallOpnd = nullptr;
    switch (builtInId)
    {
    case Js::BuiltinFunction::Math_Max:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MaxInAnArray, callInstr->m_func);
        break;

    case Js::BuiltinFunction::Math_Min:
        helperCallOpnd = IR::HelperCallOpnd::New(IR::HelperOp_MinInAnArray, callInstr->m_func);
        break;

    default:
        return instrNext;
    }

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * arrayArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &arrayArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(arrayArgOut);
    Js::OpCode originalCallOpcode = callInstr->m_opcode;
    IR::Opnd * originalCallSrc1 = callInstr->GetSrc1()->Copy(this->topFunc);
    IR::AutoReuseOpnd autoReuseOriginalCallSrc1(originalCallSrc1, this->topFunc);

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return instrNext;
    }

    *pIsInlined = true;
    // Fixed function/function object checks for target built-in
    callInstr->ReplaceSrc1(applyTargetLdInstr->GetDst());
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr =
            EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, builtInInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);
        if (useCallTargetInstr)
        {
            // The applyTarget dst already has a use in the argout, this bytecode use is not valid
            useCallTargetInstr->Remove();
        }
    }

    // Fixed function/function object checks for .apply
    callInstr->m_opcode = originalCallOpcode;
    callInstr->ReplaceSrc1(originalCallSrc1);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, applyInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr* builtInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, 3); // 3 args (implicit this + explicit this + array = 3)
    builtInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd; // We will call EndTrackCall when we see CallDirect for reasons explained in GlobOpt::TrackCalls

    IR::Instr * startCall = IR::Instr::New(Js::OpCode::StartCall,
                                           IR::RegOpnd::New(TyVar, callInstr->m_func),
                                           IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func),
                                           callInstr->m_func);
    callInstr->InsertBefore(startCall);

    IR::Opnd * linkOpnd;
    StackSym * sym;

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    IR::Instr * argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, explicitThisArgOut->GetSrc1(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    sym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    linkOpnd = IR::SymOpnd::New(sym, 0, TyVar, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A, linkOpnd, arrayArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    linkOpnd = IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1)), 0, TyMachPtr, callInstr->m_func);
    argOut = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, linkOpnd, implicitThisArgOut->GetSrc1(), argOut->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argOut);

    callInstr->m_opcode = Js::OpCode::CallDirect;
    callInstr->ReplaceSrc1(helperCallOpnd);
    callInstr->ReplaceSrc2(argOut->GetDst());

    return instrNext;
}